

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicssceneindex.cpp
# Opt level: O3

QList<QGraphicsItem_*> * __thiscall
QGraphicsSceneIndex::items
          (QList<QGraphicsItem_*> *__return_storage_ptr__,QGraphicsSceneIndex *this,QRectF *rect,
          ItemSelectionMode mode,SortOrder order,QTransform *deviceTransform)

{
  QGraphicsSceneIndexPrivate *this_00;
  long *plVar1;
  ulong uVar2;
  double dVar3;
  QRectF exposeRect;
  int *piVar4;
  uint uVar5;
  undefined1 *puVar6;
  ulong j;
  ulong i;
  long in_FS_OFFSET;
  double dVar7;
  double local_78;
  double dStack_70;
  undefined1 local_68 [16];
  undefined4 local_58;
  undefined4 uStack_54;
  undefined4 uStack_50;
  undefined4 uStack_4c;
  undefined1 *local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QGraphicsSceneIndexPrivate **)(this + 8);
  local_78 = rect->xp;
  dStack_70 = rect->yp;
  dVar3 = rect->w;
  dVar7 = rect->h;
  local_68._0_8_ = rect->w;
  local_68._8_8_ = rect->h;
  if ((dVar3 == 0.0) && (!NAN(dVar3))) {
    local_78 = local_78 + -1e-05;
    dStack_70 = dStack_70 + 0.0;
    dVar3 = dVar3 + 2e-05;
    dVar7 = dVar7 + 0.0;
    local_68._8_4_ = SUB84(dVar7,0);
    local_68._0_8_ = dVar3;
    local_68._12_4_ = (int)((ulong)dVar7 >> 0x20);
  }
  if ((dVar7 == 0.0) && (!NAN(dVar7))) {
    local_78 = local_78 + 0.0;
    dStack_70 = dStack_70 + -1e-05;
    local_68._8_8_ = dVar7 + 2e-05;
    local_68._0_8_ = dVar3;
  }
  (__return_storage_ptr__->d).d = (Data *)0x0;
  (__return_storage_ptr__->d).ptr = (QGraphicsItem **)0x0;
  (__return_storage_ptr__->d).size = 0;
  plVar1 = *(long **)&this_00->field_0x8;
  local_48 = &DAT_aaaaaaaaaaaaaaaa;
  local_58 = 0xaaaaaaaa;
  uStack_54 = 0xaaaaaaaa;
  uStack_50 = 0xaaaaaaaa;
  uStack_4c = 0xaaaaaaaa;
  (**(code **)(*plVar1 + 0x98))(&local_58,plVar1,&local_78,0);
  if (local_48 != (undefined1 *)0x0) {
    puVar6 = (undefined1 *)0x0;
    do {
      exposeRect.yp = dStack_70;
      exposeRect.xp = local_78;
      exposeRect.w = (qreal)local_68._0_8_;
      exposeRect.h = (qreal)local_68._8_8_;
      QGraphicsSceneIndexPrivate::recursive_items_helper
                (this_00,*(QGraphicsItem **)(CONCAT44(uStack_4c,uStack_50) + (long)puVar6 * 8),
                 exposeRect,QtPrivate::intersect_rect,__return_storage_ptr__,deviceTransform,mode,
                 1.0,rect);
      puVar6 = puVar6 + 1;
    } while (puVar6 < local_48);
  }
  if (order == DescendingOrder) {
    uVar2 = (__return_storage_ptr__->d).size;
    uVar5 = (uint)uVar2;
    if (1 < (int)uVar5) {
      j = (ulong)(uVar5 & 0x7fffffff);
      i = 0;
      do {
        j = j - 1;
        QList<QGraphicsItem_*>::swapItemsAt(__return_storage_ptr__,i,j);
        i = i + 1;
      } while (((uint)(uVar2 >> 1) & 0x3fffffff) != i);
    }
  }
  piVar4 = (int *)CONCAT44(uStack_54,local_58);
  if (piVar4 != (int *)0x0) {
    LOCK();
    *piVar4 = *piVar4 + -1;
    UNLOCK();
    if (*piVar4 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_54,local_58),8,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

QList<QGraphicsItem *> QGraphicsSceneIndex::items(const QRectF &rect, Qt::ItemSelectionMode mode,
                                                  Qt::SortOrder order, const QTransform &deviceTransform) const
{
    Q_D(const QGraphicsSceneIndex);
    QRectF exposeRect = rect;
    _q_adjustRect(&exposeRect);
    QList<QGraphicsItem *> itemList;
    d->items_helper(exposeRect, &QtPrivate::intersect_rect, &itemList, deviceTransform, mode, order, &rect);
    return itemList;
}